

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# camgeom.cc
# Opt level: O2

void gmath::refineOptimal(Matrix33d *F,Vector3d *p0,Vector3d *p1)

{
  undefined1 auVar1 [16];
  double dVar2;
  double dVar3;
  double dVar4;
  undefined1 auVar5 [16];
  SMatrix<double,_3,_3> *a;
  SMatrix<double,_3,_3> *a_00;
  SMatrix<double,_3,_3> *a_01;
  SMatrix<double,_3,_3> *a_02;
  undefined4 uVar6;
  undefined4 uVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  undefined1 auVar11 [16];
  double dVar12;
  double dVar13;
  double dVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  double dVar17;
  Polynomiald p;
  SVector<double,_3> local_3d0;
  undefined1 local_3b8 [16];
  double local_3a8;
  undefined8 uStack_3a0;
  double local_398;
  undefined8 uStack_390;
  double local_388;
  undefined8 uStack_380;
  double local_378;
  undefined8 uStack_370;
  vector<double,_std::allocator<double>_> r;
  SMatrix<double,_3,_3> local_318;
  SMatrix<double,_3,_3> local_2d0;
  Vector3d e1;
  Vector3d e0;
  Vector3d W;
  Matrix33d R1;
  Matrix33d R0;
  Matrix33d V;
  Matrix33d U;
  Matrix33d invT1;
  Matrix33d invT0;
  Matrix33d F2;
  
  SMatrix<double,_3,_3>::SMatrix(&invT0);
  SMatrix<double,_3,_3>::SMatrix((SMatrix<double,_3,_3> *)&invT1);
  invT0.v[0][2] = p0->v[0] / p0->v[2];
  invT0.v[1][2] = p0->v[1] / p0->v[2];
  invT1.v[0][2] = p1->v[0] / p1->v[2];
  invT1.v[1][2] = p1->v[1] / p1->v[2];
  transpose<double,3,3>(&V,(gmath *)&invT1,a);
  operator*(&U,&V,F);
  operator*(&F2,&U,&invT0);
  SMatrix<double,_3,_3>::SMatrix(&U);
  SMatrix<double,_3,_3>::SMatrix(&V);
  SVector<double,_3>::SVector(&W);
  svd<double,3,3>(&F2,&U,&W,&V);
  SMatrix<double,_3,_3>::getColumn(&e0,&V,2);
  SMatrix<double,_3,_3>::getColumn(&e1,&U,2);
  SVector<double,_3>::operator/=
            (&e0,SQRT((double)CONCAT44(e0.v[0]._4_4_,e0.v[0]._0_4_) *
                      (double)CONCAT44(e0.v[0]._4_4_,e0.v[0]._0_4_) +
                      (double)CONCAT44(e0.v[1]._4_4_,e0.v[1]._0_4_) *
                      (double)CONCAT44(e0.v[1]._4_4_,e0.v[1]._0_4_)));
  SVector<double,_3>::operator/=
            (&e1,SQRT((double)CONCAT44(e1.v[0]._4_4_,e1.v[0]._0_4_) *
                      (double)CONCAT44(e1.v[0]._4_4_,e1.v[0]._0_4_) +
                      (double)CONCAT44(e1.v[1]._4_4_,e1.v[1]._0_4_) *
                      (double)CONCAT44(e1.v[1]._4_4_,e1.v[1]._0_4_)));
  SMatrix<double,_3,_3>::SMatrix((SMatrix<double,_3,_3> *)&R0);
  R0.v[0][0]._0_4_ = e0.v[0]._0_4_;
  R0.v[0][0]._4_4_ = e0.v[0]._4_4_;
  R0.v[0][1]._0_4_ = e0.v[1]._0_4_;
  R0.v[0][1]._4_4_ = e0.v[1]._4_4_;
  R0.v[1][0]._4_4_ = e0.v[1]._4_4_ ^ 0x80000000;
  R0.v[1][0]._0_4_ = e0.v[1]._0_4_;
  R0.v[1][1]._0_4_ = e0.v[0]._0_4_;
  R0.v[1][1]._4_4_ = e0.v[0]._4_4_;
  R0.v[2][2] = 1.0;
  SMatrix<double,_3,_3>::SMatrix(&R1);
  R1.v[0][0]._0_4_ = e1.v[0]._0_4_;
  R1.v[0][0]._4_4_ = e1.v[0]._4_4_;
  R1.v[0][1]._0_4_ = e1.v[1]._0_4_;
  R1.v[0][1]._4_4_ = e1.v[1]._4_4_;
  R1.v[1][0]._4_4_ = e1.v[1]._4_4_ ^ 0x80000000;
  R1.v[1][0]._0_4_ = e1.v[1]._0_4_;
  R1.v[1][1]._0_4_ = e1.v[0]._0_4_;
  R1.v[1][1]._4_4_ = e1.v[0]._4_4_;
  R1.v[2][2] = 1.0;
  operator*(&local_318,&R1,&F2);
  transpose<double,3,3>((SMatrix<double,_3,_3> *)&r,(gmath *)&R0,a_00);
  operator*(&local_2d0,&local_318,(SMatrix<double,_3,_3> *)&r);
  SMatrix<double,_3,_3>::operator=(&F2,&local_2d0);
  dVar9 = F2.v[1][2] * F2.v[1][2];
  dVar2 = F2.v[2][2] * F2.v[2][2];
  Polynomial<double>::Polynomial(&p);
  uStack_370 = 0x8000000000000000;
  local_378 = -(F2.v[1][1] * F2.v[1][2]) * dVar2;
  dVar12 = dVar9 * F2.v[2][1] * F2.v[2][2];
  Polynomial<double>::set(&p,0,dVar12 + local_378);
  dVar8 = e1.v[2] * e1.v[2];
  dVar13 = F2.v[1][1] * F2.v[1][1];
  dVar10 = F2.v[2][1] * F2.v[2][1];
  dVar17 = dVar9 + dVar9;
  Polynomial<double>::set
            (&p,1,dVar2 * dVar2 * dVar8 * dVar8 +
                  dVar17 * dVar2 * dVar8 + ((dVar9 * dVar9 + dVar9 * dVar10) - dVar13 * dVar2));
  dVar14 = e0.v[2] * e0.v[2];
  local_3a8 = -dVar13;
  uStack_3a0 = 0x8000000000000000;
  dVar3 = F2.v[1][1] * F2.v[1][2] * dVar10;
  dVar4 = F2.v[2][1] * local_3a8 * F2.v[2][2];
  local_3b8._8_8_ = 0;
  local_3b8._0_8_ = dVar4;
  local_398 = (F2.v[1][1] + F2.v[1][1]) * F2.v[1][2];
  uStack_390 = 0;
  local_388 = F2.v[1][1] * 4.0 * F2.v[1][2];
  uStack_380 = 0;
  Polynomial<double>::set
            (&p,2,F2.v[2][1] * 4.0 * dVar2 * F2.v[2][2] * dVar8 * dVar8 +
                  local_388 * dVar2 * dVar8 +
                  dVar9 * 4.0 * F2.v[2][1] * F2.v[2][2] * dVar8 +
                  ((F2.v[2][1] * dVar17 * F2.v[2][2] * dVar14 +
                   F2.v[1][1] * 4.0 * dVar9 * F2.v[1][2] + dVar3 + dVar4) -
                  dVar2 * local_398 * dVar14));
  dVar4 = dVar13 + dVar13;
  Polynomial<double>::set
            (&p,3,dVar10 * 6.0 * dVar2 * dVar8 * dVar8 +
                  dVar4 * dVar2 * dVar8 +
                  F2.v[1][1] * 8.0 * F2.v[1][2] * F2.v[2][1] * F2.v[2][2] * dVar8 +
                  dVar17 * dVar10 * dVar8 +
                  ((dVar13 * 6.0 * dVar9 + dVar14 * dVar17 * dVar10) - dVar4 * dVar2 * dVar14));
  dVar17 = dVar14 * dVar14;
  Polynomial<double>::set
            (&p,4,dVar10 * 4.0 * F2.v[2][1] * F2.v[2][2] * dVar8 * dVar8 +
                  dVar13 * 4.0 * F2.v[2][1] * F2.v[2][2] * dVar8 +
                  local_388 * dVar10 * dVar8 +
                  local_378 * dVar17 +
                  dVar12 * dVar17 +
                  ((F2.v[1][1] * dVar13 * 4.0 * F2.v[1][2] + local_398 * dVar10 * dVar14) -
                  F2.v[2][1] * dVar4 * F2.v[2][2] * dVar14));
  Polynomial<double>::set
            (&p,5,dVar10 * dVar10 * dVar8 * dVar8 +
                  dVar4 * dVar10 * dVar8 +
                  dVar2 * local_3a8 * dVar17 + dVar13 * dVar13 + dVar9 * dVar10 * dVar17);
  Polynomial<double>::set(&p,6,dVar3 * dVar17 + (double)local_3b8._0_8_ * dVar17);
  realRoots(&r,&p);
  uVar6 = 0xffffffff;
  uVar7 = 0x7fefffff;
  dVar2 = 1.79769313486232e+308;
  for (a_01 = (SMatrix<double,_3,_3> *)0x0;
      (SMatrix<double,_3,_3> *)
      ((long)r.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
             _M_finish -
       (long)r.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
             _M_start >> 3) != a_01; a_01 = (SMatrix<double,_3,_3> *)((long)a_01->v[0] + 1)) {
    dVar9 = r.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
            _M_start[(long)a_01];
    dVar12 = F2.v[1][1] * dVar9 + F2.v[1][2];
    dVar17 = F2.v[2][1] * dVar9 + F2.v[2][2];
    dVar12 = dVar12 * dVar12 + dVar8 * dVar17 * dVar17;
    if ((dVar12 != 0.0) || (NAN(dVar12))) {
      auVar15._0_8_ = dVar9 * dVar9;
      auVar15._8_8_ = dVar17 * dVar17;
      auVar5._8_8_ = dVar12;
      auVar5._0_8_ = dVar14 * dVar9 * dVar9 + 1.0;
      auVar16 = divpd(auVar15,auVar5);
      dVar12 = auVar16._8_8_ + auVar16._0_8_;
      if (dVar12 < dVar2) {
        uVar6 = SUB84(dVar9,0);
        uVar7 = (undefined4)((ulong)dVar9 >> 0x20);
        dVar2 = dVar12;
      }
    }
  }
  if (((dVar14 <= 0.0) || (dVar9 = dVar8 * F2.v[2][1] * F2.v[2][1] + dVar13, dVar9 <= 0.0)) ||
     (auVar11._8_8_ = dVar10, auVar11._0_8_ = 0x3ff0000000000000, auVar16._8_8_ = dVar9,
     auVar16._0_8_ = dVar14, auVar16 = divpd(auVar11,auVar16),
     dVar2 <= auVar16._8_8_ + auVar16._0_8_)) {
    dVar2 = (double)CONCAT44(uVar7,uVar6) * (double)CONCAT44(uVar7,uVar6);
    p0->v[0] = e0.v[2] * dVar2;
    p0->v[1] = (double)CONCAT44(uVar7,uVar6);
    p0->v[2] = dVar2 * dVar14 + 1.0;
    dVar10 = F2.v[2][1] * (double)CONCAT44(uVar7,uVar6) + F2.v[2][2];
    dVar2 = F2.v[1][1] * (double)CONCAT44(uVar7,uVar6) + F2.v[1][2];
    auVar1._8_4_ = SUB84(dVar10 * -dVar2,0);
    auVar1._0_8_ = dVar10 * e1.v[2] * dVar10;
    auVar1._12_4_ = (int)((ulong)(dVar10 * -dVar2) >> 0x20);
    *(undefined1 (*) [16])p1->v = auVar1;
    dVar13 = dVar8 * dVar10 * dVar10 + dVar2 * dVar2;
  }
  else {
    p0->v[0] = e0.v[2];
    p0->v[1] = 0.0;
    p0->v[2] = dVar14;
    p1->v[0] = dVar10 * e1.v[2];
    p1->v[1] = -F2.v[1][1] * F2.v[2][1];
    dVar13 = dVar8 * dVar10 + dVar13;
  }
  p1->v[2] = dVar13;
  transpose<double,3,3>(&local_318,(gmath *)&R0,a_01);
  operator*(&local_2d0,&invT0,&local_318);
  SMatrix<double,_3,_3>::operator*(&local_3d0,&local_2d0,p0);
  SVector<double,_3>::operator=(p0,&local_3d0);
  transpose<double,3,3>(&local_318,(gmath *)&R1,a_02);
  operator*(&local_2d0,&invT1,&local_318);
  SMatrix<double,_3,_3>::operator*(&local_3d0,&local_2d0,p1);
  SVector<double,_3>::operator=(p1,&local_3d0);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&r.super__Vector_base<double,_std::allocator<double>_>);
  Polynomial<double>::~Polynomial(&p);
  return;
}

Assistant:

void refineOptimal(const Matrix33d &F, Vector3d &p0, Vector3d &p1)
{
  // the implementation follows Hartley and Zisserman's (2003, pp. 318)

  Matrix33d invT0;
  Matrix33d invT1;
  invT0(0, 2)=p0[0]/p0[2];
  invT0(1, 2)=p0[1]/p0[2];
  invT1(0, 2)=p1[0]/p1[2];
  invT1(1, 2)=p1[1]/p1[2];

  // transform F

  Matrix33d F2=transpose(invT1)*F*invT0;

  // get epipoles of new fundamental matrix

  Matrix33d U, V;
  Vector3d W;
  svd(F2, U, W, V);
  Vector3d e0=V.getColumn(2);
  Vector3d e1=U.getColumn(2);

  // compute rotations

  e0/=sqrt(e0[0]*e0[0]+e0[1]*e0[1]);
  e1/=sqrt(e1[0]*e1[0]+e1[1]*e1[1]);
  Matrix33d R0;
  R0(0, 0)=e0[0];
  R0(0, 1)=e0[1];
  R0(1, 0)=-e0[1];
  R0(1, 1)=e0[0];
  R0(2, 2)=1;
  Matrix33d R1;
  R1(0, 0)=e1[0];
  R1(0, 1)=e1[1];
  R1(1, 0)=-e1[1];
  R1(1, 1)=e1[0];
  R1(2, 2)=1;

  // compute new F

  F2=R1*F2*transpose(R0);

  // compute coefficients of polynomial

  const double f=e0[2];
  const double g=e1[2];
  const double a=F2(1, 1);
  const double b=F2(1, 2);
  const double c=F2(2, 1);
  const double d=F2(2, 2);
  const double f2=f*f;
  const double f4=f2*f2;
  const double g2=g*g;
  const double a2=a*a;
  const double b2=b*b;
  const double c2=c*c;
  const double d2=d*d;

  Polynomiald p;
  p.set(0, b2*c*d-a*b*d2);
  p.set(1, b2*b2+b2*c2-a2*d2+2*b2*d2*g2+d2*d2*g2*g2);
  p.set(2, 4*a*b2*b+a*b*c2-a2*c*d+2*b2*c*d*f2-2*a*b*d2*f2+4*b2*c*d*g2+4*a*b*d2*g2
        +4*c*d2*d*g2*g2);
  p.set(3, 6*a2*b2+2*b2*c2*f2-2*a2*d2*f2+2*b2*c2*g2+8*a*b*c*d*g2+2*a2*d2*g2
        +6*c2*d2*g2*g2);
  p.set(4, 4*a2*a*b+2*a*b*c2*f2-2*a2*c*d*f2+b2*c*d*f4-a*b*d2*f4+4*a*b*c2*g2
        +4*a2*c*d*g2+4*c2*c*d*g2*g2);
  p.set(5, a2*a2+b2*c2*f4-a2*d2*f4+2*a2*c2*g2+c2*c2*g2*g2);
  p.set(6, a*b*c2*f4-a2*c*d*f4);

  // setting polynomial to 0 and get all real roots

  std::vector<double> r=realRoots(p);

  // find global minima (solution is t)

  double t=std::numeric_limits<double>::max();
  double mins=std::numeric_limits<double>::max();

  for (size_t i=0; i<r.size(); i++)
  {
    double s=(a*r[i]+b)*(a*r[i]+b)+g*g*(c*r[i]+d)*(c*r[i]+d);

    if (s != 0)
    {
      s=r[i]*r[i]/(1+f*f*r[i]*r[i])+(c*r[i]+d)*(c*r[i]+d)/s;

      if (s < mins)
      {
        t=r[i];
        mins=s;
      }
    }
  }

  // get optimal corner positions

  if (f*f > 0 && a*a+g*g*c*c > 0 && 1/(f*f)+c*c/(a*a+g*g*c*c) < mins)
  {
    p0[0]=f;
    p0[1]=0;
    p0[2]=f2;
    p1[0]=g*c2;
    p1[1]=-a*c;
    p1[2]=g2*c2+a2;
  }
  else
  {
    p0[0]=t*t*f;
    p0[1]=t;
    p0[2]=t*t*f2+1;
    p1[0]=g*(c*t+d)*(c*t+d);
    p1[1]=-(a*t+b)*(c*t+d);
    p1[2]=g2*(c*t+d)*(c*t+d)+(a*t+b)*(a*t+b);
  }

  // transform refined points back

  p0=invT0*transpose(R0)*p0;
  p1=invT1*transpose(R1)*p1;
}